

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall luna::State::FullGCRoot(State *this,GCObjectVisitor *v)

{
  pointer pVVar1;
  Value *value;
  pointer this_00;
  _List_node_base *p_Var2;
  
  Value::Accept(&this->global_,v);
  pVVar1 = (this->stack_).stack_.super__Vector_base<luna::Value,_std::allocator<luna::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->stack_).stack_.super__Vector_base<luna::Value,_std::allocator<luna::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pVVar1; this_00 = this_00 + 1
      ) {
    Value::Accept(this_00,v);
  }
  for (p_Var2 = (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->calls_; p_Var2 = p_Var2->_M_next) {
    Value::Accept((Value *)p_Var2[1]._M_next,v);
    if (p_Var2[1]._M_prev != (_List_node_base *)0x0) {
      Value::Accept((Value *)p_Var2[1]._M_prev,v);
    }
  }
  return;
}

Assistant:

void State::FullGCRoot(GCObjectVisitor *v)
    {
        // Visit global table
        global_.Accept(v);

        // Visit stack values
        for (const auto &value : stack_.stack_)
        {
            value.Accept(v);
        }

        // Visit call info
        for (const auto &call : calls_)
        {
            call.register_->Accept(v);
            if (call.func_)
            {
                call.func_->Accept(v);
            }
        }
    }